

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

bool __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::
matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
          (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
           *this,TokenType t1,TokenType others,TokenType others_1,TokenType others_2,
          TokenType others_3,TokenType others_4,TokenType others_5,TokenType others_6)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  
  __s1 = *(char **)(this + 0x28);
  if (__s1 == t1.text) {
LAB_0020061d:
    bVar1 = true;
  }
  else {
    if (t1.text != (char *)0x0 && __s1 != (char *)0x0) {
      iVar2 = strcmp(__s1,t1.text);
      if (iVar2 == 0) goto LAB_0020061d;
    }
    bVar1 = matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                      (this,others,others_1,others_2,others_3,others_4,others_5,others_6);
  }
  return bVar1;
}

Assistant:

bool matchesAny (Type1 t1, Args... others) const            { return matches (t1) || matchesAny (others...); }